

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

void __thiscall foxxll::request::error_occured(request *this,string *msg)

{
  io_error *this_00;
  string *msg_local;
  request *this_local;
  
  this_00 = (io_error *)operator_new(0x20);
  io_error::io_error(this_00,msg);
  std::unique_ptr<foxxll::io_error,_std::default_delete<foxxll::io_error>_>::reset
            (&this->error_,this_00);
  return;
}

Assistant:

void request::error_occured(const std::string& msg)
{
    error_.reset(new io_error(msg));
}